

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

void __thiscall utf8_ptr::dec(utf8_ptr *this,size_t *rem)

{
  char *pcVar1;
  
  pcVar1 = s_dec(this->p_);
  *rem = (size_t)(this->p_ + (*rem - (long)pcVar1));
  this->p_ = pcVar1;
  return;
}

Assistant:

void dec(size_t *rem)
    {
        /* calculate the decrement amount */
        char *p = s_dec(p_);

        /* decrement the length counter by the change */
        *rem += (p_ - p);
        
        /* save the new pointer value */
        p_ = p;
    }